

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O3

void test_qclab_qgates_iSWAP_check<std::complex<double>>
               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v1,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v2)

{
  pointer pcVar1;
  pointer pcVar2;
  char *pcVar3;
  double unaff_R12;
  double unaff_R13;
  double unaff_R14;
  ulong uVar4;
  char *in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper in_stack_ffffffffffffffc8;
  
  pcVar1 = (v1->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (v1->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pcVar2 - (long)pcVar1 ==
      (long)(v2->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(v2->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
            _M_impl.super__Vector_impl_data._M_start) {
    if (pcVar2 != pcVar1) {
      uVar4 = 0;
      do {
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffc8.data_,unaff_R14,
                   unaff_R13,unaff_R12);
        if (in_stack_ffffffffffffffb0 == '\0') {
          testing::Message::Message((Message *)&local_40);
          pcVar3 = "";
          if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = (local_48->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                     ,0x10,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
          if (local_40._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_40._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffc8.data_,unaff_R14,
                   unaff_R13,unaff_R12);
        if (in_stack_ffffffffffffffb0 == '\0') {
          testing::Message::Message((Message *)&local_40);
          pcVar3 = "";
          if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = (local_48->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                     ,0x11,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&local_40);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
          if (local_40._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_40._M_head_impl + 8))();
          }
        }
        if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_48,local_48);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)(v1->
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(v1->
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    return;
  }
  __assert_fail("v1.size() == v2.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                ,9,
                "void test_qclab_qgates_iSWAP_check(const std::vector<T> &, const std::vector<T> &) [T = std::complex<double>]"
               );
}

Assistant:

void test_qclab_qgates_iSWAP_check( const std::vector< T >& v1 ,
                                    const std::vector< T >& v2 ) {

  assert( v1.size() == v2.size() ) ;

  using R = qclab::real_t< T > ;
  const R eps = std::numeric_limits< R >::epsilon() ;
  const R tol = 100 * eps ;

  for ( size_t i = 0; i < v1.size(); i++ ) {
    EXPECT_NEAR( std::real( v1[i] ) , std::real( v2[i] ) , tol ) ;
    EXPECT_NEAR( std::imag( v1[i] ) , std::imag( v2[i] ) , tol ) ;
  }

}